

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

void __thiscall QToolBarLayout::setGeometry(QToolBarLayout *this,QRect *rect)

{
  undefined4 uVar1;
  Representation RVar2;
  int iVar4;
  ulong uVar3;
  ulong uVar5;
  Representation RVar6;
  int iVar7;
  QRect QVar8;
  bool bVar9;
  int iVar10;
  Orientation OVar11;
  ToolBarArea TVar12;
  LayoutDirection direction;
  QWidget *pQVar13;
  QStyle *pQVar14;
  QMainWindow *this_00;
  undefined8 uVar15;
  byte bVar16;
  int iVar17;
  int iVar18;
  Representation RVar19;
  Representation RVar20;
  Representation RVar21;
  Representation RVar22;
  Representation RVar23;
  long in_FS_OFFSET;
  QMargins QVar24;
  QStyleOptionToolBar opt;
  QRect local_a8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  pQVar13 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (pQVar13 == (QWidget *)0x0) goto LAB_004b6104;
  pQVar14 = QWidget::style(pQVar13);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_98);
  (**(code **)(*(long *)pQVar13 + 0x1a0))(pQVar13,(QStyleOptionToolBar *)local_98);
  QVar24 = QLayout::contentsMargins(&this->super_QLayout);
  iVar10 = (**(code **)(*(long *)pQVar14 + 0xe0))
                     (pQVar14,0x39,(QStyleOptionToolBar *)local_98,pQVar13);
  OVar11 = QToolBar::orientation((QToolBar *)pQVar13);
  QLayout::setGeometry(&this->super_QLayout,rect);
  QVar8 = local_a8;
  bVar16 = (this->super_QLayout).super_QLayoutItem.field_0xd;
  if (bVar16 == 0) {
    local_a8.y1.m_i = ((rect->y2).m_i - (rect->y1).m_i) + 1;
    local_a8.x1.m_i = ((rect->x2).m_i - (rect->x1).m_i) + 1;
    local_a8._8_8_ = QVar8._8_8_;
    bVar9 = layoutActions(this,(QSize *)&local_a8);
    bVar16 = (this->super_QLayout).super_QLayoutItem.field_0xd;
  }
  else {
    bVar9 = false;
  }
  if ((((this->super_QLayout).super_QLayoutItem.field_0xc == '\0') && (bVar9 == false)) &&
     ((bVar16 & 1) == 0)) {
    if ((((this->extension->super_QToolButton).super_QAbstractButton.super_QWidget.data)->
         widget_attributes & 0x10000) == 0) {
      QWidget::hide((QWidget *)this->extension);
    }
  }
  else {
    RVar22 = QVar24.m_bottom.m_i;
    this_00 = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    if (this_00 == (QMainWindow *)0x0) {
      TVar12 = TopToolBarArea;
    }
    else {
      TVar12 = QMainWindow::toolBarArea(this_00,(QToolBar *)pQVar13);
    }
    uVar15 = (**(code **)(*(long *)&this->super_QLayout + 0xf0))(this);
    uVar1 = rect->x2;
    iVar4 = (rect->y2).m_i;
    iVar17 = iVar4;
    if (OVar11 == Horizontal) {
      iVar17 = uVar1;
    }
    RVar2 = QVar24.m_right.m_i;
    RVar19.m_i = RVar2.m_i;
    if (OVar11 == Horizontal) {
      RVar19.m_i = RVar22.m_i;
    }
    iVar18 = (iVar17 - (RVar19.m_i + iVar10)) + 2;
    iVar17 = 0;
    local_a8.x1.m_i = iVar18;
    if (OVar11 != Horizontal) {
      local_a8.x1.m_i = 0;
      iVar17 = iVar18;
    }
    iVar18 = (int)((ulong)uVar15 >> 0x20);
    RVar19 = QVar24.m_left.m_i;
    RVar21 = QVar24.m_top.m_i;
    if ((TVar12 == TopToolBarArea) || (TVar12 == LeftToolBarArea)) {
      uVar3._0_4_ = rect->x1;
      uVar3._4_4_ = rect->y1;
      uVar5 = uVar3 >> 0x20;
      if (OVar11 == Vertical) {
        uVar5 = uVar3;
      }
      RVar20.m_i = RVar19.m_i;
      if (OVar11 == Vertical) {
        RVar20.m_i = RVar21.m_i;
      }
      local_a8.y1.m_i = RVar20.m_i + (int)uVar5;
      if (OVar11 != Vertical) goto LAB_004b607e;
LAB_004b601f:
      iVar4 = (int)uVar15 - (RVar2.m_i + RVar19.m_i);
      local_a8.x1.m_i = local_a8.y1.m_i;
      local_a8.y1.m_i = iVar17;
    }
    else {
      RVar23.m_i = RVar22.m_i;
      RVar20.m_i = RVar21.m_i;
      RVar6.m_i = RVar2.m_i;
      iVar7 = iVar18;
      if (OVar11 == Vertical) {
        RVar23.m_i = RVar2.m_i;
        RVar20.m_i = RVar19.m_i;
        RVar6.m_i = RVar22.m_i;
        iVar7 = (int)uVar15;
      }
      if (OVar11 == Vertical) {
        iVar4 = uVar1;
      }
      local_a8.y1.m_i = ((RVar23.m_i + RVar20.m_i) - (iVar7 + RVar6.m_i)) + 1 + iVar4;
      if (OVar11 == Vertical) goto LAB_004b601f;
LAB_004b607e:
      iVar4 = -1;
      if (OVar11 == Horizontal) {
        iVar4 = iVar10;
      }
      iVar10 = iVar18 - (RVar22.m_i + RVar21.m_i);
    }
    local_a8.x2.m_i = iVar4 + local_a8.x1.m_i + -1;
    local_a8.y2.m_i = local_a8.y1.m_i + iVar10 + -1;
    if (OVar11 == Horizontal) {
      pQVar13 = QLayout::parentWidget(&this->super_QLayout);
      direction = QWidget::layoutDirection(pQVar13);
      local_a8 = QStyle::visualRect(direction,rect,&local_a8);
    }
    QWidget::setGeometry((QWidget *)this->extension,&local_a8);
    if ((((this->extension->super_QToolButton).super_QAbstractButton.super_QWidget.data)->
         widget_attributes & 0x10000) != 0) {
      QWidget::show((QWidget *)this->extension);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_98);
LAB_004b6104:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarLayout::setGeometry(const QRect &rect)
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const QMargins margins = contentsMargins();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    QLayout::setGeometry(rect);

    updateMacBorderMetrics();

    bool ranOutOfSpace = false;
    if (!animating)
        ranOutOfSpace = layoutActions(rect.size());

    if (expanded || animating || ranOutOfSpace) {
        Qt::ToolBarArea area = Qt::TopToolBarArea;
        if (QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget()))
            area = win->toolBarArea(tb);
        QSize hint = sizeHint();

        QPoint pos;
        rpick(o, pos) = pick(o, rect.bottomRight()) -
                pick(o, QSize(margins.bottom(), margins.right())) - extensionExtent + 2;
        if (area == Qt::LeftToolBarArea || area == Qt::TopToolBarArea)
            rperp(o, pos) = perp(o, rect.topLeft()) +
                    perp(o, QSize(margins.top(), margins.left()));
        else
            rperp(o, pos) = perp(o, rect.bottomRight()) -
                    perp(o, QSize(margins.bottom(), margins.right())) -
                    (perp(o, hint) - perp(o, margins)) + 1;
        QSize size;
        rpick(o, size) = extensionExtent;
        rperp(o, size) = perp(o, hint) - perp(o, margins);
        QRect r(pos, size);

        if (o == Qt::Horizontal)
            r = QStyle::visualRect(parentWidget()->layoutDirection(), rect, r);

        extension->setGeometry(r);

        if (extension->isHidden())
            extension->show();
    } else {
        if (!extension->isHidden())
            extension->hide();
    }
}